

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperUtils.c
# Opt level: O1

void Map_MappingUnmark_rec(Map_Node_t *pNode)

{
  int iVar1;
  
  do {
    if (((ulong)pNode & 1) != 0) {
      __assert_fail("!Map_IsComplement(pNode)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mapper/mapperUtils.c"
                    ,0xb7,"void Map_MappingUnmark_rec(Map_Node_t *)");
    }
    if ((*(uint *)&pNode->field_0x1c & 1) == 0) {
      return;
    }
    *(uint *)&pNode->field_0x1c = *(uint *)&pNode->field_0x1c & 0xfffffffe;
    iVar1 = Map_NodeIsAnd(pNode);
    if (iVar1 == 0) {
      return;
    }
    Map_MappingUnmark_rec((Map_Node_t *)((ulong)pNode->p1 & 0xfffffffffffffffe));
    Map_MappingUnmark_rec((Map_Node_t *)((ulong)pNode->p2 & 0xfffffffffffffffe));
    pNode = pNode->pNextE;
  } while (pNode != (Map_Node_t *)0x0);
  return;
}

Assistant:

void Map_MappingUnmark_rec( Map_Node_t * pNode )
{
    assert( !Map_IsComplement(pNode) );
    if ( pNode->fMark0 == 0 )
        return;
    pNode->fMark0 = 0;
    if ( !Map_NodeIsAnd(pNode) )
        return;
    Map_MappingUnmark_rec( Map_Regular(pNode->p1) );
    Map_MappingUnmark_rec( Map_Regular(pNode->p2) );
    // visit the equivalent nodes
    if ( pNode->pNextE )
        Map_MappingUnmark_rec( pNode->pNextE );
}